

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>
::Matrix(Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>
         *this,uint numberOfColumns,Characteristic characteristic)

{
  double dVar1;
  Column_settings *pCVar2;
  __hashtable *__this_1;
  __hashtable *__this;
  
  pCVar2 = (Column_settings *)operator_new(0x38);
  (pCVar2->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (pCVar2->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.list.
  ptr = (char *)0x0;
  (pCVar2->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.list.
  sz = 0;
  (pCVar2->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  requested_size = 0x18;
  (pCVar2->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  next_size = 0x20;
  (pCVar2->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  start_size = 0x20;
  (pCVar2->entryConstructor).entryPool_.super_pool<boost::default_user_allocator_malloc_free>.
  max_size = 0;
  this->colSettings_ = pCVar2;
  *(Underlying_matrix **)
   ((long)&(this->matrix_).super_Chain_vine_swap_option.super_type.
           super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
           .barcode_.
           super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
           ._M_impl + 8) = &this->matrix_;
  *(Underlying_matrix **)
   &(this->matrix_).super_Chain_vine_swap_option.super_type.
    super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
    .barcode_.
    super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
    ._M_impl._M_node = &this->matrix_;
  *(size_t *)
   ((long)&(this->matrix_).super_Chain_vine_swap_option.super_type.
           super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
           .barcode_.
           super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
           ._M_impl + 0x10) = 0;
  (this->matrix_).super_Chain_vine_swap_option.super_type.
  super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
  .indexToBar_._M_h._M_buckets =
       &(this->matrix_).super_Chain_vine_swap_option.super_type.
        super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
        .indexToBar_._M_h._M_single_bucket;
  (this->matrix_).super_Chain_vine_swap_option.super_type.
  super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
  .indexToBar_._M_h._M_bucket_count = 1;
  (this->matrix_).super_Chain_vine_swap_option.super_type.
  super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
  .indexToBar_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->matrix_).super_Chain_vine_swap_option.super_type.
  super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
  .indexToBar_._M_h._M_element_count = 0;
  (this->matrix_).super_Chain_vine_swap_option.super_type.
  super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
  .indexToBar_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(size_t *)
   ((long)&(this->matrix_).super_Chain_vine_swap_option.super_type.
           super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
           .indexToBar_._M_h._M_rehash_policy + 8) = 0;
  (this->matrix_).super_Chain_vine_swap_option.super_type.
  super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
  .indexToBar_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->matrix_).super_Chain_vine_swap_option.super_type.
  super_Chain_pairing<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>
  .nextPosition_ = 0;
  (this->matrix_).super_Chain_vine_swap_option.super_type.pivotToPosition_._M_h._M_buckets =
       &(this->matrix_).super_Chain_vine_swap_option.super_type.pivotToPosition_._M_h.
        _M_single_bucket;
  (this->matrix_).super_Chain_vine_swap_option.super_type.pivotToPosition_._M_h._M_bucket_count = 1;
  (this->matrix_).super_Chain_vine_swap_option.super_type.pivotToPosition_._M_h._M_before_begin.
  _M_nxt = (_Hash_node_base *)0x0;
  (this->matrix_).super_Chain_vine_swap_option.super_type.pivotToPosition_._M_h._M_element_count = 0
  ;
  (this->matrix_).super_Chain_vine_swap_option.super_type.pivotToPosition_._M_h._M_rehash_policy.
  _M_max_load_factor = 1.0;
  (this->matrix_).super_Chain_vine_swap_option.super_type.pivotToPosition_._M_h._M_rehash_policy.
  _M_next_resize = 0;
  (this->matrix_).super_Chain_vine_swap_option.super_type.pivotToPosition_._M_h._M_single_bucket =
       (__node_base_ptr)0x0;
  *(undefined8 *)
   &(this->matrix_).super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->matrix_).super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor +
   8) = 0;
  (this->matrix_).super_Chain_vine_swap_option.birthComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->matrix_).super_Chain_vine_swap_option.birthComp_._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)
   &(this->matrix_).super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor = 0;
  *(undefined8 *)
   ((long)&(this->matrix_).super_Chain_vine_swap_option.deathComp_.super__Function_base._M_functor +
   8) = 0;
  (this->matrix_).super_Chain_vine_swap_option.deathComp_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (this->matrix_).super_Chain_vine_swap_option.deathComp_._M_invoker = (_Invoker_type)0x0;
  (this->matrix_).matrix_._M_h._M_buckets = &(this->matrix_).matrix_._M_h._M_single_bucket;
  (this->matrix_).matrix_._M_h._M_bucket_count = 1;
  (this->matrix_).matrix_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->matrix_).matrix_._M_h._M_element_count = 0;
  (this->matrix_).matrix_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->matrix_).matrix_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->matrix_).matrix_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->matrix_).pivotToColumnIndex_._M_h._M_buckets =
       &(this->matrix_).pivotToColumnIndex_._M_h._M_single_bucket;
  (this->matrix_).pivotToColumnIndex_._M_h._M_bucket_count = 1;
  (this->matrix_).pivotToColumnIndex_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->matrix_).pivotToColumnIndex_._M_h._M_element_count = 0;
  (this->matrix_).pivotToColumnIndex_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->matrix_).pivotToColumnIndex_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->matrix_).pivotToColumnIndex_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->matrix_).nextIndex_ = 0;
  (this->matrix_).colSettings_ = pCVar2;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->matrix_).matrix_._M_h,(ulong)numberOfColumns);
  dVar1 = ceil((double)numberOfColumns /
               (double)(this->matrix_).pivotToColumnIndex_._M_h._M_rehash_policy._M_max_load_factor)
  ;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::rehash(&(this->matrix_).pivotToColumnIndex_._M_h,
           (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f | (long)dVar1);
  return;
}

Assistant:

inline Matrix<PersistenceMatrixOptions>::Matrix(unsigned int numberOfColumns, Characteristic characteristic)
    : colSettings_(new Column_settings(characteristic)),
      matrix_(numberOfColumns, colSettings_)
{
  static_assert(PersistenceMatrixOptions::is_of_boundary_type || !PersistenceMatrixOptions::has_vine_update ||
                    PersistenceMatrixOptions::has_column_pairings,
                "When no barcode is recorded with vine swaps for chain matrices, comparison functions for the columns "
                "have to be provided.");
  _assert_options();
}